

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

Boxed_Value __thiscall chaiscript::detail::const_var_impl<float>(detail *this,float *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<const_float> local_28;
  float *local_18;
  float *t_local;
  
  local_18 = t;
  t_local = (float *)this;
  std::make_shared<float_const,float_const&>((float *)&local_28);
  Boxed_Value::Boxed_Value<std::shared_ptr<float_const>,void>((Boxed_Value *)this,&local_28,false);
  std::shared_ptr<const_float>::~shared_ptr(&local_28);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value const_var_impl(const T &t) {
      return Boxed_Value(std::make_shared<typename std::add_const<T>::type>(t));
    }